

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

BDD sylvan_sat_one_bdd(BDD bdd)

{
  uint32_t uVar1;
  uint uVar2;
  mtbddnode_t node_00;
  MTBDD bdd_00;
  MTBDD bdd_01;
  BDD BVar3;
  undefined8 local_40;
  BDD result;
  BDD m;
  BDD high;
  BDD low;
  mtbddnode_t node;
  BDD bdd_local;
  
  if (bdd == 0) {
    bdd_local = 0;
  }
  else if (bdd == 0x8000000000000000) {
    bdd_local = 0x8000000000000000;
  }
  else {
    node_00 = MTBDD_GETNODE(bdd);
    bdd_00 = mtbddnode_followlow(bdd,node_00);
    bdd_01 = mtbddnode_followhigh(bdd,node_00);
    if (bdd_00 == 0) {
      BVar3 = sylvan_sat_one_bdd(bdd_01);
      uVar1 = mtbddnode_getvariable(node_00);
      local_40 = mtbdd_makenode(uVar1,0,BVar3);
    }
    else if (bdd_01 == 0) {
      BVar3 = sylvan_sat_one_bdd(bdd_00);
      uVar1 = mtbddnode_getvariable(node_00);
      local_40 = mtbdd_makenode(uVar1,BVar3,0);
    }
    else {
      uVar2 = rand();
      if ((uVar2 & 0x2000) == 0) {
        BVar3 = sylvan_sat_one_bdd(bdd_01);
        uVar1 = mtbddnode_getvariable(node_00);
        local_40 = mtbdd_makenode(uVar1,0,BVar3);
      }
      else {
        BVar3 = sylvan_sat_one_bdd(bdd_00);
        uVar1 = mtbddnode_getvariable(node_00);
        local_40 = mtbdd_makenode(uVar1,BVar3,0);
      }
    }
    bdd_local = local_40;
  }
  return bdd_local;
}

Assistant:

BDD
sylvan_sat_one_bdd(BDD bdd)
{
    if (bdd == sylvan_false) return sylvan_false;
    if (bdd == sylvan_true) return sylvan_true;

    bddnode_t node = MTBDD_GETNODE(bdd);
    BDD low = node_low(bdd, node);
    BDD high = node_high(bdd, node);

    BDD m;

    BDD result;
    if (low == sylvan_false) {
        m = sylvan_sat_one_bdd(high);
        result = sylvan_makenode(bddnode_getvariable(node), sylvan_false, m);
    } else if (high == sylvan_false) {
        m = sylvan_sat_one_bdd(low);
        result = sylvan_makenode(bddnode_getvariable(node), m, sylvan_false);
    } else {
        if (rand() & 0x2000) {
            m = sylvan_sat_one_bdd(low);
            result = sylvan_makenode(bddnode_getvariable(node), m, sylvan_false);
        } else {
            m = sylvan_sat_one_bdd(high);
            result = sylvan_makenode(bddnode_getvariable(node), sylvan_false, m);
        }
    }

    return result;
}